

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O1

bool __thiscall pbrt::SquareMatrix<3>::operator!=(SquareMatrix<3> *this,SquareMatrix<3> *m2)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  bool bVar4;
  Float *pFVar5;
  Float *pFVar6;
  ulong uVar7;
  ulong uVar8;
  
  pFVar5 = m2->m[0] + 1;
  pFVar6 = this->m[0] + 1;
  bVar4 = true;
  uVar7 = 0;
  do {
    fVar1 = this->m[uVar7][0];
    fVar2 = m2->m[uVar7][0];
    if (fVar1 != fVar2) {
      return bVar4;
    }
    if (NAN(fVar1) || NAN(fVar2)) {
      return bVar4;
    }
    uVar3 = 0;
    do {
      uVar8 = uVar3;
      if (uVar8 == 2) goto LAB_00241712;
    } while ((pFVar6[uVar8] == pFVar5[uVar8]) &&
            (uVar3 = uVar8 + 1, !NAN(pFVar6[uVar8]) && !NAN(pFVar5[uVar8])));
    if (uVar8 < 2) {
      return bVar4;
    }
LAB_00241712:
    bVar4 = uVar7 < 2;
    uVar7 = uVar7 + 1;
    pFVar5 = pFVar5 + 3;
    pFVar6 = pFVar6 + 3;
    if (uVar7 == 3) {
      return bVar4;
    }
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    bool operator!=(const SquareMatrix<N> &m2) const {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                if (m[i][j] != m2.m[i][j])
                    return true;
        return false;
    }